

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  time_t tVar1;
  bool END_GAME;
  bool player2;
  bool player1;
  bool bots;
  Direction direction_2;
  Direction direction_1;
  thread thread_for_read_input;
  vector<Snake_*,_std::allocator<Snake_*>_> snakes;
  reference_wrapper<Direction> local_530;
  vector<Food_*,_std::allocator<Food_*>_> foods;
  Page page;
  reference_wrapper<bool> local_4a0;
  reference_wrapper<Direction> local_498;
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  Food f3;
  Food f2;
  Snake B3;
  Snake S2;
  Snake S1;
  Snake B2;
  Food f1;
  Snake B1;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  direction_1 = LEFT;
  END_GAME = false;
  direction_2 = LEFT;
  bots = false;
  player1 = false;
  player2 = false;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"BOT 1",(allocator<char> *)&B2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"\x1b[35m",(allocator<char> *)&B3);
  Snake::Snake(&B1,(Point)0x300000016,5,&local_310,'o',&local_330,true);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"BOT 2",(allocator<char> *)&B3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"\x1b[36m",(allocator<char> *)&S1);
  Snake::Snake(&B2,(Point)0x30000000d,5,&local_350,'o',&local_370,true);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"BOT 3",(allocator<char> *)&S1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"\x1b[32m",(allocator<char> *)&S2);
  Snake::Snake(&B3,(Point)0x1000000003,5,&local_390,'o',&local_3b0,true);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"PLAYER 1",(allocator<char> *)&S2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"\x1b[34m",(allocator<char> *)&page);
  Snake::Snake(&S1,(Point)0x300000003,5,&local_3d0,'o',&local_3f0,false);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"PLAYER 2",(allocator<char> *)&page);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"\x1b[31m",(allocator<char> *)&f1);
  Snake::Snake(&S2,(Point)0x1000000016,5,&local_410,'o',&local_430,false);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            (local_450,"\x1b[1m\x1b[33m",(allocator<char> *)&page);
  f1.point.x = 0xf;
  f1.point.y = 10;
  f1.value = 1;
  f1.shape = '1';
  std::__cxx11::string::string((string *)&f1.color,local_450);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::string<std::allocator<char>>
            (local_470,"\x1b[1m\x1b[33m",(allocator<char> *)&page);
  f2.point.x = 10;
  f2.point.y = 10;
  f2.value = 3;
  f2.shape = '3';
  std::__cxx11::string::string((string *)&f2.color,local_470);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"\x1b[1m\x1b[33m",(allocator<char> *)&page);
  f3.point.x = 0x14;
  f3.point.y = 10;
  f3.value = 5;
  f3.shape = '5';
  std::__cxx11::string::string((string *)&f3.color,local_490);
  std::__cxx11::string::~string(local_490);
  page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&f1;
  std::vector<Food*,std::allocator<Food*>>::emplace_back<Food*>
            ((vector<Food*,std::allocator<Food*>> *)&foods,(Food **)&page);
  page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&f2;
  std::vector<Food*,std::allocator<Food*>>::emplace_back<Food*>
            ((vector<Food*,std::allocator<Food*>> *)&foods,(Food **)&page);
  page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&f3;
  std::vector<Food*,std::allocator<Food*>>::emplace_back<Food*>
            ((vector<Food*,std::allocator<Food*>> *)&foods,(Food **)&page);
  menu(&bots,&player1,&player2);
  if (bots == true) {
    page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&B1;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&snakes,(Snake **)&page);
    page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&B2;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&snakes,(Snake **)&page);
    page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&B3;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&snakes,(Snake **)&page);
  }
  if (player1 == true) {
    page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&S1;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&snakes,(Snake **)&page);
  }
  if (player2 == true) {
    page.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&S2;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&snakes,(Snake **)&page);
  }
  Page::Page(&page,&snakes,&foods);
  Page::print(&page);
  local_530._M_data = &direction_1;
  local_498._M_data = &direction_2;
  local_4a0._M_data = &END_GAME;
  std::thread::
  thread<void(&)(Direction&,Direction&,bool&),std::reference_wrapper<Direction>,std::reference_wrapper<Direction>,std::reference_wrapper<bool>,void>
            (&thread_for_read_input,read_input,&local_530,&local_498,&local_4a0);
  while (END_GAME == false) {
    local_530._M_data = (Direction *)0x12c;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_530);
    Page::move_once(&page,&direction_1,&direction_2,&END_GAME);
    Page::print(&page);
  }
  std::thread::join();
  std::thread::~thread(&thread_for_read_input);
  Page::~Page(&page);
  std::__cxx11::string::~string((string *)&f3.color);
  std::__cxx11::string::~string((string *)&f2.color);
  std::__cxx11::string::~string((string *)&f1.color);
  Snake::~Snake(&S2);
  Snake::~Snake(&S1);
  Snake::~Snake(&B3);
  Snake::~Snake(&B2);
  Snake::~Snake(&B1);
  std::_Vector_base<Food_*,_std::allocator<Food_*>_>::~_Vector_base
            (&foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>);
  std::_Vector_base<Snake_*,_std::allocator<Snake_*>_>::~_Vector_base
            (&snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>);
  return 0;
}

Assistant:

int main()
{
	srand(time(0));	

    // Setting
	bool END_GAME = false;
	Direction direction_1 = LEFT;
	Direction direction_2 = LEFT;
	int LEVEL = EASY;
	bool bots = false;
	bool player1 = false;
	bool player2 = false;

	vector<Snake*> snakes;
	vector<Food*> foods;

	Snake B1(Point(22, 3), 5, "BOT 1", 'o', MAGENTA, BOT);
	Snake B2(Point(13, 3), 5, "BOT 2", 'o', CYAN, BOT);
	Snake B3(Point(3, 16), 5, "BOT 3", 'o', GREEN, BOT);

	Snake S1(Point(3, 3), 5, "PLAYER 1", 'o', BLUE, NOT_BOT);
	Snake S2(Point(22, 16), 5, "PLAYER 2", 'o', RED, NOT_BOT);

	Food f1(Point(15, 10), 1, '1', BOLDYELLOW);
	Food f2(Point(10, 10), 3, '3', BOLDYELLOW);
	Food f3(Point(20, 10), 5, '5', BOLDYELLOW);

	foods.push_back(&f1);
	foods.push_back(&f2);
	foods.push_back(&f3);

	menu(bots, player1, player2);
	
	// BOTS	
	if(bots)
	{
		snakes.push_back(&B1);
		snakes.push_back(&B2);
		snakes.push_back(&B3);
	}

	// PLAYERS
	if(player1)
		snakes.push_back(&S1);

	if(player2)	
		snakes.push_back(&S2);

	
	// Page setting
	Page page(snakes, foods);
	page.print();
	
	thread thread_for_read_input(read_input, ref(direction_1), ref(direction_2), ref(END_GAME));

	while(!END_GAME)
	{
        this_thread::sleep_for(chrono::milliseconds(LEVEL));
		page.move_once(direction_1, direction_2, END_GAME);
		page.print();	
	}
	thread_for_read_input.join();

}